

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O1

void Engine::retrieve_assumption_nogood(vec<BoolView> *xs)

{
  Lit LVar1;
  Reason *pRVar2;
  vec<Lit> *pvVar3;
  Clause *pCVar4;
  vec<BoolView> *this;
  anon_union_8_2_743a5d44_for_Reason_0 aVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  Lit *elem;
  vec<Lit> *this_00;
  int iVar14;
  ulong uVar15;
  Lit p;
  vec<Lit> removed;
  vec<Lit> out_nogood;
  Lit local_84;
  Lit local_80;
  Lit local_7c;
  undefined1 local_78 [8];
  Lit *pLStack_70;
  vec<Lit> local_68;
  uint local_54;
  ulong local_50;
  anon_union_8_2_743a5d44_for_Reason_0 local_48;
  ulong local_40;
  vec<BoolView> *local_38;
  
  local_68.sz = 0;
  local_68.cap = 0;
  local_68.data = (Lit *)0x0;
  uVar6 = sat.trail.sz - 1;
  local_40 = (ulong)uVar6;
  local_7c.x = engine.assumptions.data[local_40];
  uVar15 = (ulong)uVar6;
  if (0 < (int)uVar6) {
    uVar8 = 0;
    do {
      sat.seen.data[(uint)(engine.assumptions.data[uVar8] >> 1)] = '\x02';
      uVar8 = uVar8 + 1;
    } while (uVar15 != uVar8);
  }
  local_78 = (undefined1  [8])(CONCAT44(local_78._4_4_,local_7c.x) ^ 1);
  local_38 = xs;
  vec<Lit>::push(&local_68,(Lit *)local_78);
  LVar1.x = local_7c.x;
  pCVar4 = sat.short_expl;
  pRVar2 = sat.reason.data;
  local_78 = (undefined1  [8])0x0;
  pLStack_70 = (Lit *)0x0;
  uVar6 = local_7c.x >> 1;
  if (-1 < sat.trailpos.data[uVar6]) {
    aVar5 = (anon_union_8_2_743a5d44_for_Reason_0)sat.reason.data[uVar6].field_0._pt;
    uVar12 = aVar5._0_4_ & 3;
    if ((aVar5._a & 3) != 0) {
      if (uVar12 == 1) {
        SAT::btToPos(&sat,sat.index,sat.trailpos.data[uVar6]);
        aVar5._pt = SAT::_getExpl(&sat,(Lit)(LVar1.x ^ 1));
      }
      else {
        *(uint *)sat.short_expl = uVar12 << 8 | (uint)*(byte *)sat.short_expl;
        if (((ulong)aVar5 & 3) == 0 || uVar12 == 1) {
LAB_001ba065:
          abort();
        }
        *(uint *)(pCVar4 + 1) = *(uint *)&pRVar2[uVar6].field_0 >> 2;
        aVar5._pt = sat.short_expl;
        if (uVar12 == 3) {
          pCVar4[1].data[0].x = *(int *)((long)&pRVar2[uVar6].field_0 + 4);
          aVar5._pt = sat.short_expl;
        }
      }
    }
    if (aVar5._pt == (Clause *)0x0) {
      vec<Lit>::push(&local_68,&local_7c);
    }
    else {
      iVar11 = 0;
      local_50 = uVar15;
      if (0x1ff < *(uint *)aVar5._pt) {
        iVar11 = 0;
        uVar15 = 1;
        do {
          if (*(uint *)aVar5._pt >> 8 <= uVar15) goto LAB_001ba065;
          local_84.x = (aVar5._pt)->data[uVar15].x;
          sat.seen.data[(uint)(local_84.x >> 1)] = sat.seen.data[(uint)(local_84.x >> 1)] | 1;
          if (sat.trailpos.data[(uint)(local_84.x >> 1)] < 0) {
            vec<Lit>::push((vec<Lit> *)local_78,&local_84);
          }
          else {
            iVar11 = iVar11 + 1;
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 < *(uint *)aVar5._pt >> 8);
      }
      uVar15 = local_50;
      if (iVar11 != 0) {
        local_48 = (anon_union_8_2_743a5d44_for_Reason_0)
                   sat.reason.data[(uint)(local_7c.x >> 1)].field_0._pt;
        uVar6 = sat.trail.sz - 1;
        do {
          pvVar3 = sat.trail.data;
          if ((int)uVar6 < 1) break;
          sat.index = sat.trail.data[uVar6].sz;
          uVar12 = uVar6;
          do {
            pCVar4 = sat.short_expl;
            pRVar2 = sat.reason.data;
            uVar8 = (ulong)(uint)sat.index;
            uVar15 = uVar8;
            do {
              uVar15 = uVar15 - 1;
              if (uVar15 == 0xffffffffffffffff) {
                SAT::btToLevel(&sat,uVar12 - 1);
                uVar12 = uVar12 - 1;
                goto LAB_001b9f4a;
              }
              sat.index = (int)uVar8 - 1;
              uVar8 = (ulong)(uint)sat.index;
            } while ((sat.seen.data[(uint)(pvVar3[uVar6].data[uVar15 & 0xffffffff].x >> 1)] & 1U) ==
                     0);
            LVar1.x = pvVar3[uVar6].data[uVar15 & 0xffffffff].x;
            iVar11 = iVar11 + -1;
            uVar7 = LVar1.x >> 1;
            local_84.x = LVar1.x;
            if ((sat.seen.data[uVar7] & 2U) == 0) {
              vec<Lit>::push((vec<Lit> *)local_78,&local_84);
              LVar1.x = local_84.x;
              pCVar4 = sat.short_expl;
              pRVar2 = sat.reason.data;
              uVar7 = local_84.x >> 1;
              iVar14 = 7;
              if (local_48._pt != sat.reason.data[uVar7].field_0._pt) {
                local_48 = (anon_union_8_2_743a5d44_for_Reason_0)sat.reason.data[uVar7].field_0._pt;
                uVar10 = (uint)local_48._a & 3;
                aVar5 = local_48;
                if ((local_48._a & 3) != 0) {
                  if (uVar10 == 1) {
                    SAT::btToPos(&sat,sat.index,sat.trailpos.data[uVar7]);
                    aVar5._pt = SAT::_getExpl(&sat,LVar1);
                  }
                  else {
                    *(uint *)sat.short_expl = uVar10 << 8 | (uint)*(byte *)sat.short_expl;
                    if ((local_48._a & 3) == 0 || uVar10 == 1) goto LAB_001ba065;
                    *(uint *)(pCVar4 + 1) = *(uint *)&pRVar2[uVar7].field_0 >> 2;
                    aVar5._pt = sat.short_expl;
                    if (uVar10 == 3) {
                      pCVar4[1].data[0].x = *(int *)((long)&pRVar2[uVar7].field_0 + 4);
                      aVar5._pt = sat.short_expl;
                    }
                  }
                }
                if (0x1ff < *(uint *)aVar5._pt) {
                  uVar8 = 1;
                  local_54 = uVar12;
                  do {
                    if (*(uint *)aVar5._pt >> 8 <= uVar8) goto LAB_001ba065;
                    local_80.x = (aVar5._pt)->data[uVar8].x;
                    uVar12 = local_80.x >> 1;
                    if ((sat.seen.data[uVar12] & 1U) == 0) {
                      sat.seen.data[uVar12] = sat.seen.data[uVar12] | 1;
                      if (sat.trailpos.data[uVar12] < 0) {
                        vec<Lit>::push((vec<Lit> *)local_78,&local_80);
                      }
                      else {
                        iVar11 = iVar11 + 1;
                      }
                    }
                    uVar8 = uVar8 + 1;
                    uVar12 = local_54;
                  } while (uVar8 < *(uint *)aVar5._pt >> 8);
                }
                iVar14 = 0;
              }
            }
            else {
              aVar5 = (anon_union_8_2_743a5d44_for_Reason_0)sat.reason.data[uVar7].field_0._a;
              uVar10 = aVar5._0_4_ & 3;
              if ((aVar5._a & 3) != 0) {
                if (uVar10 == 1) {
                  SAT::btToPos(&sat,sat.index,sat.trailpos.data[uVar7]);
                  aVar5._pt = SAT::_getExpl(&sat,LVar1);
                }
                else {
                  *(uint *)sat.short_expl = uVar10 << 8 | (uint)*(byte *)sat.short_expl;
                  if (((ulong)aVar5 & 3) == 0 || uVar10 == 1) goto LAB_001ba065;
                  *(uint *)(pCVar4 + 1) = *(uint *)&pRVar2[uVar7].field_0 >> 2;
                  aVar5._pt = sat.short_expl;
                  if (uVar10 == 3) {
                    pCVar4[1].data[0].x = *(int *)((long)&pRVar2[uVar7].field_0 + 4);
                    aVar5._pt = sat.short_expl;
                  }
                }
              }
              if (aVar5._pt == (Clause *)0x0) {
                local_80.x = local_84.x ^ 1;
                this_00 = &local_68;
                elem = &local_80;
LAB_001b9f11:
                vec<Lit>::push(this_00,elem);
              }
              else {
                iVar14 = 9;
                if (0x1ff < *(uint *)aVar5._pt) {
                  lVar9 = (ulong)(*(uint *)aVar5._pt >> 8) - 1;
                  lVar13 = 0;
                  do {
                    if (lVar9 == lVar13) goto LAB_001ba065;
                    if ((sat.seen.data[(uint)((int)((uint *)(aVar5._a + 8))[lVar13] >> 1)] & 1U) ==
                        0) {
                      local_80.x = local_84.x ^ 1;
                      vec<Lit>::push(&local_68,&local_80);
                      iVar14 = 0xc;
                      break;
                    }
                    lVar13 = lVar13 + 1;
                  } while (lVar9 != lVar13);
                }
                if (iVar14 != 0xc) {
                  if (iVar14 != 9) goto LAB_001b9f27;
                  this_00 = (vec<Lit> *)local_78;
                  elem = &local_84;
                  goto LAB_001b9f11;
                }
              }
              iVar14 = 7;
              if (iVar11 == 0) {
                iVar14 = 0xd;
              }
            }
LAB_001b9f27:
          } while ((iVar14 == 0) || (iVar14 == 7));
LAB_001b9f4a:
          uVar6 = uVar12;
        } while (uVar15 == 0xffffffffffffffff);
        if (local_78._0_4_ != 0) {
          uVar15 = 0;
          do {
            sat.seen.data[(uint)(pLStack_70[uVar15].x >> 1)] =
                 sat.seen.data[(uint)(pLStack_70[uVar15].x >> 1)] & 0xfe;
            uVar15 = uVar15 + 1;
          } while (uVar15 < ((ulong)local_78 & 0xffffffff));
        }
        uVar15 = local_50;
        if (local_68.sz != 0) {
          uVar8 = 0;
          do {
            sat.seen.data[(uint)(local_68.data[uVar8].x >> 1)] =
                 sat.seen.data[(uint)(local_68.data[uVar8].x >> 1)] & 0xfe;
            uVar8 = uVar8 + 1;
          } while (uVar8 < (local_68._0_8_ & 0xffffffff));
        }
      }
    }
  }
  if (pLStack_70 != (Lit *)0x0) {
    free(pLStack_70);
  }
  this = local_38;
  if (local_68.sz != 0) {
    uVar8 = 0;
    do {
      local_78 = (undefined1  [8])&PTR_finished_0020fb28;
      pLStack_70 = (Lit *)(CONCAT35(pLStack_70._5_3_,
                                    CONCAT14((char)local_68.data[uVar8].x,
                                             local_68.data[uVar8].x >> 1)) & 0xffffff01ffffffff);
      vec<BoolView>::push(this,(BoolView *)local_78);
      uVar8 = uVar8 + 1;
    } while (uVar8 < (local_68._0_8_ & 0xffffffff));
  }
  if (0 < (int)local_40) {
    uVar8 = 0;
    do {
      sat.seen.data[(uint)(engine.assumptions.data[uVar8] >> 1)] = '\x02';
      uVar8 = uVar8 + 1;
    } while (uVar15 != uVar8);
  }
  if (local_68.data != (Lit *)0x0) {
    free(local_68.data);
  }
  return;
}

Assistant:

void Engine::retrieve_assumption_nogood(vec<BoolView>& xs) {
	vec<Lit> out_nogood;
	const int assump_sz = sat.decisionLevel();
	assert(assump_sz < static_cast<int>(engine.assumptions.size()));

	const Lit q(toLit(engine.assumptions[assump_sz]));
	assert(sat.value(q) == l_False);

	// Mark the available assumptions
	for (int ii = 0; ii < assump_sz; ii++) {
		assert(sat.value(toLit(engine.assumptions[ii])) == l_True);
		sat.seen[engine.assumptions[ii] >> 1] = 2;
	}

	// Collect the nogood.
	// pushback_reason([](Lit p) { return sat.seen[var(p)]&2; }, q, out_nogood);
	pushback_reason_lazy([](Lit p) { return sat.seen[var(p)] & 2; }, q, out_nogood);

	for (unsigned int ii = 0; ii < out_nogood.size(); ii++) {
		xs.push(out_nogood[ii]);
	}

	// Finally, clear the marked assumptions
	for (int ii = 0; ii < assump_sz; ii++) {
		sat.seen[engine.assumptions[ii] >> 1] = 2;
	}
}